

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_action.c
# Opt level: O0

int s98c_set_part(s98c *ctx,int part)

{
  int part_local;
  s98c *ctx_local;
  
  if ((ctx->header).version == -1) {
    fprintf(_stderr,"error: Missing #version\n");
    ctx_local._4_4_ = 1;
  }
  else if ((uint)part < (ctx->header).device_count << 1) {
    ctx->current_device = part;
    ctx_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"error: Use of part %c exceeds number of defined #device\'s\n",
            (ulong)(part + 0x41));
    ctx_local._4_4_ = 2;
  }
  return ctx_local._4_4_;
}

Assistant:

int s98c_set_part(struct s98c* ctx, int part)
{
    if(ctx->header.version == -1) {
        fprintf(stderr, "error: Missing #version\n");
        return 1;
    }
    if(part >= ctx->header.device_count * 2) {
        fprintf(stderr, "error: Use of part %c exceeds number of defined #device's\n",
                part + 'A');
        return 2;
    }

    ctx->current_device = part;
    return 0;
}